

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

bool bValidReq(json *json,
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *keys)

{
  bool bVar1;
  size_type sVar2;
  reference key;
  reference this;
  iterator iVar3;
  _Bit_iterator _Var4;
  _Bit_iterator __last;
  _Bit_iterator_base local_d8;
  _Bit_type *local_c8;
  uint local_c0;
  bool local_b1;
  _Bit_type *local_b0;
  uint local_a8;
  _Bit_type *local_a0;
  uint local_98;
  _Bit_type *local_90;
  uint local_88;
  _Bit_type *local_80;
  uint local_78;
  undefined1 local_70 [8];
  iterator it;
  ulong local_50;
  size_t i;
  vector<bool,_std::allocator<bool>_> vTest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *keys_local;
  json *json_local;
  
  vTest.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)keys;
  std::vector<bool,_std::allocator<bool>_>::vector((vector<bool,_std::allocator<bool>_> *)&i);
  for (local_50 = 0;
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(keys), local_50 < sVar2; local_50 = local_50 + 1) {
    key = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](keys,local_50);
    this = nlohmann::
           basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
           ::operator[](json,key);
    bVar1 = nlohmann::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::empty(this);
    if (bVar1) {
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&i,false);
    }
    else {
      std::vector<bool,_std::allocator<bool>_>::push_back
                ((vector<bool,_std::allocator<bool>_> *)&i,true);
    }
  }
  iVar3 = std::vector<bool,_std::allocator<bool>_>::begin((vector<bool,_std::allocator<bool>_> *)&i)
  ;
  local_90 = iVar3.super__Bit_iterator_base._M_p;
  local_88 = iVar3.super__Bit_iterator_base._M_offset;
  local_80 = local_90;
  local_78 = local_88;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)&i);
  local_b0 = iVar3.super__Bit_iterator_base._M_p;
  local_a8 = iVar3.super__Bit_iterator_base._M_offset;
  local_b1 = false;
  _Var4.super__Bit_iterator_base._M_offset = local_78;
  _Var4.super__Bit_iterator_base._M_p = local_80;
  _Var4.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._12_4_ = 0;
  __last.super__Bit_iterator_base._M_p =
       (_Bit_type *)SUB128(iVar3.super__Bit_iterator_base._0_12_,0);
  __last.super__Bit_iterator_base._M_offset = SUB124(iVar3.super__Bit_iterator_base._0_12_,8);
  local_a0 = local_b0;
  local_98 = local_a8;
  _Var4 = std::find<std::_Bit_iterator,bool>(_Var4,__last,&local_b1);
  local_c8 = _Var4.super__Bit_iterator_base._M_p;
  local_c0 = _Var4.super__Bit_iterator_base._M_offset;
  local_70 = (undefined1  [8])local_c8;
  it.super__Bit_iterator_base._M_p._0_4_ = local_c0;
  iVar3 = std::vector<bool,_std::allocator<bool>_>::end((vector<bool,_std::allocator<bool>_> *)&i);
  local_d8._M_p = iVar3.super__Bit_iterator_base._M_p;
  local_d8._M_offset = iVar3.super__Bit_iterator_base._M_offset;
  bVar1 = std::operator!=((_Bit_iterator_base *)local_70,&local_d8);
  json_local._7_1_ = !bVar1;
  std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&i);
  return json_local._7_1_;
}

Assistant:

bool bValidReq(nlohmann::json json, std::vector<std::string> keys)
{
	std::vector<bool> vTest;

	for (size_t i = 0; i < keys.size(); i++)
	{
		if (!json[keys[i]].empty())
			vTest.push_back(true);
		else
			vTest.push_back(false);
	}

	std::vector<bool>::iterator it = std::find(vTest.begin(), vTest.end(), false);

	if (it != vTest.end())
		return false;
	else
		return true;
}